

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O1

ArgOption<unsigned_int> * __thiscall
Utils::ArgumentParser::make_option<unsigned_int>
          (ArgumentParser *this,string *name,string *description,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *opts)

{
  pointer *pppVVar1;
  iterator __position;
  pointer pbVar2;
  pointer pcVar3;
  iterator iVar4;
  ArgOption<unsigned_int> *this_00;
  pointer pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  key_type local_80;
  undefined1 local_60 [32];
  ArgOption<unsigned_int> *local_40;
  _Base_ptr local_38;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar4._M_node != &(this->used_name)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("used_name.find(name) == used_name.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/ArgumentParser.hpp"
                  ,0x105,
                  "ArgOption<T> &Utils::ArgumentParser::make_option(const std::string &, const std::string &, const std::vector<std::string> &) [T = unsigned int]"
                 );
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this,name);
  this_00 = (ArgOption<unsigned_int> *)operator_new(0x68);
  ArgOption<unsigned_int>::ArgOption(this_00,name,description,opts);
  __position._M_current =
       (this->options).
       super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_60._0_8_ = this_00;
  if (__position._M_current ==
      (this->options).
      super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Utils::ValueArgObj*,std::allocator<Utils::ValueArgObj*>>::
    _M_realloc_insert<Utils::ValueArgObj*>
              ((vector<Utils::ValueArgObj*,std::allocator<Utils::ValueArgObj*>> *)&this->options,
               __position,(ValueArgObj **)local_60);
  }
  else {
    *__position._M_current = (ValueArgObj *)this_00;
    pppVVar1 = &(this->options).
                super__Vector_base<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  pbVar5 = (opts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (opts->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar2) {
    local_38 = &(this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      pcVar3 = (pbVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar3,pcVar3 + pbVar5->_M_string_length);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->used_identifier)._M_t,&local_80);
      if (iVar4._M_node != local_38) {
        __assert_fail("used_identifier.find(i) == used_identifier.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/ArgumentParser.hpp"
                      ,0x10c,
                      "ArgOption<T> &Utils::ArgumentParser::make_option(const std::string &, const std::string &, const std::vector<std::string> &) [T = unsigned int]"
                     );
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->used_identifier,&local_80);
      local_60._0_8_ = local_60 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      local_40 = this_00;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>,std::_Select1st<std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,Utils::ArgOption<unsigned_int>*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>,std::_Select1st<std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Utils::ValueArgObj*>>>
                  *)&this->option_mapping,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgOption<unsigned_int>_*>
                  *)local_60);
      if ((ArgOption<unsigned_int> *)local_60._0_8_ != (ArgOption<unsigned_int> *)(local_60 + 0x10))
      {
        operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar2);
  }
  return this_00;
}

Assistant:

ArgOption<T>& ArgumentParser::make_option( const std::string& name,
        const std::string& description, const std::vector<std::string>& opts) {
    assert(used_name.find(name) == used_name.end());
    used_name.insert(name);

    auto o = new ArgOption<T>(name,description,opts);
    options.push_back(o);

    for ( auto i : opts ) {
        assert(used_identifier.find(i) == used_identifier.end());
        used_identifier.insert(i);

        option_mapping.insert( make_pair (i, o));
    }

    return *o;
}